

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::OnV128ConstExpr(BinaryReaderIR *this,v128 value_bits)

{
  Result RVar1;
  Location *in_R8;
  v128 val;
  Location local_b8;
  Const *local_98;
  uint8_t local_90 [8];
  Const local_88;
  undefined1 local_38 [8];
  unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> local_30;
  undefined1 local_28 [8];
  BinaryReaderIR *this_local;
  v128 value_bits_local;
  
  local_90 = value_bits.v._8_8_;
  local_98 = value_bits.v._0_8_;
  local_28 = (undefined1  [8])this;
  unique0x100000d7 = local_98;
  value_bits_local.v._0_8_ = local_90;
  GetLocation(&local_b8,this);
  val.v._8_8_ = &local_b8;
  val.v[0] = local_90[0];
  val.v[1] = local_90[1];
  val.v[2] = local_90[2];
  val.v[3] = local_90[3];
  val.v[4] = local_90[4];
  val.v[5] = local_90[5];
  val.v[6] = local_90[6];
  val.v[7] = local_90[7];
  Const::V128(&local_88,local_98,val,in_R8);
  std::make_unique<wabt::ConstExpr,wabt::Const>((Const *)local_38);
  std::unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>>::
  unique_ptr<wabt::ConstExpr,std::default_delete<wabt::ConstExpr>,void>
            ((unique_ptr<wabt::Expr,std::default_delete<wabt::Expr>> *)&local_30,
             (unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> *)local_38);
  value_bits_local.v._8_4_ = AppendExpr(this,&local_30);
  std::unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_>::~unique_ptr(&local_30);
  std::unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_>::~unique_ptr
            ((unique_ptr<wabt::ConstExpr,_std::default_delete<wabt::ConstExpr>_> *)local_38);
  RVar1.enum_._0_1_ = value_bits_local.v[8];
  RVar1.enum_._1_1_ = value_bits_local.v[9];
  RVar1.enum_._2_1_ = value_bits_local.v[10];
  RVar1.enum_._3_1_ = value_bits_local.v[0xb];
  return (Result)RVar1.enum_;
}

Assistant:

Result BinaryReaderIR::OnV128ConstExpr(v128 value_bits) {
  return AppendExpr(
      std::make_unique<ConstExpr>(Const::V128(value_bits, GetLocation())));
}